

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O3

int funchook_page_alloc(funchook_t *funchook,funchook_page_t **page_out,uint8_t *func,
                       ip_displacement_t *disp)

{
  char cVar1;
  void *__addr;
  FILE *__stream;
  char *pcVar2;
  ulong uVar3;
  funchook_page_t *pfVar4;
  int *piVar5;
  int iVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  long lVar10;
  bool bVar11;
  uint8_t *local_1060;
  void *addrs [2];
  char errbuf [128];
  
  iVar6 = 0;
  do {
    __stream = fopen("/proc/self/maps","r");
    if (__stream == (FILE *)0x0) {
      piVar5 = __errno_location();
      pcVar2 = strerror_r(*piVar5,errbuf,0x40);
      funchook_set_error_message(funchook,"Failed to open /proc/self/maps (%s)",pcVar2);
      return -1;
    }
    addrs[0] = (void *)0x0;
    addrs[1] = (void *)0x0;
    pcVar2 = fgets(errbuf,0x1000,__stream);
    if (pcVar2 == (char *)0x0) {
      local_1060 = (uint8_t *)0x0;
      puVar7 = (uint8_t *)0x0;
    }
    else {
      local_1060 = (uint8_t *)0x0;
      puVar7 = (uint8_t *)0x0;
      do {
        pcVar2 = errbuf;
        puVar8 = (uint8_t *)0x0;
        while( true ) {
          while( true ) {
            pcVar2 = pcVar2 + 1;
            cVar1 = pcVar2[-1];
            if (9 < (byte)(cVar1 - 0x30U)) break;
            puVar8 = (uint8_t *)((long)puVar8 << 4 | (ulong)((int)cVar1 - 0x30));
          }
          if (5 < (byte)(cVar1 + 0x9fU)) break;
          puVar8 = (uint8_t *)((long)puVar8 * 0x10 + (ulong)((int)cVar1 - 0x57));
        }
        if (cVar1 != '-') break;
        puVar9 = (uint8_t *)0x0;
        while( true ) {
          while( true ) {
            cVar1 = *pcVar2;
            pcVar2 = pcVar2 + 1;
            if (9 < (byte)(cVar1 - 0x30U)) break;
            puVar9 = (uint8_t *)((long)puVar9 << 4 | (ulong)((int)cVar1 - 0x30));
          }
          if (5 < (byte)(cVar1 + 0x9fU)) break;
          puVar9 = (uint8_t *)((long)puVar9 * 0x10 + (ulong)((int)cVar1 - 0x57));
        }
        if (cVar1 != ' ') break;
        funchook_log(funchook,"  process map: %016lx-%016lx, prev_end=%lx,addr={%lx,%lx},psz=%lx\n",
                     puVar8,puVar9,puVar7,local_1060,0,0x1000);
        if (puVar7 + 0x1000 <= puVar8) {
          if ((puVar8 < func) &&
             (puVar8 = puVar8 + -0x1000, (ulong)((long)func - (long)puVar8) < 0x7fffffff)) {
            local_1060 = puVar8;
            addrs[0] = puVar8;
          }
          uVar3 = (long)puVar7 - (long)func;
          if (func <= puVar7 && uVar3 != 0) goto LAB_00102121;
        }
        pcVar2 = fgets(errbuf,0x1000,__stream);
        puVar7 = puVar9;
      } while (pcVar2 != (char *)0x0);
    }
    uVar3 = (long)puVar7 - (long)func;
    if (puVar7 < func || uVar3 == 0) {
      fclose(__stream);
      funchook_set_error_message(funchook,"Could not find a free region near %p",func);
      return 8;
    }
LAB_00102121:
    puVar8 = puVar7;
    if (0x7ffffffe < uVar3) {
      puVar7 = (uint8_t *)0x0;
      puVar8 = (uint8_t *)addrs[1];
    }
    addrs[1] = puVar8;
    funchook_log(funchook,"  -- Use address %p or %p for function %p\n",local_1060,puVar7,func);
    fclose(__stream);
    lVar10 = 1;
    do {
      __addr = addrs[lVar10];
      if (__addr != (void *)0x0) {
        pfVar4 = (funchook_page_t *)mmap(__addr,0x1000,3,0x22,-1,0);
        *page_out = pfVar4;
        if (((ulong)((long)func - (long)pfVar4) < 0x7fffefff) ||
           ((ulong)((long)pfVar4 - (long)func) < 0x7fffefff)) {
          funchook_log(funchook,"  allocate page %p (size=%lu)\n",pfVar4,0x1000);
          return 0;
        }
        if (pfVar4 == (funchook_page_t *)0xffffffffffffffff) {
          piVar5 = __errno_location();
          pcVar2 = strerror_r(*piVar5,errbuf,0x80);
          funchook_set_error_message(funchook,"mmap failed(addr=%p): %s",__addr,pcVar2);
          return 8;
        }
        funchook_log(funchook,"  try to allocate %p but %p (size=%lu)\n",__addr,pfVar4,0x1000);
        munmap(*page_out,0x1000);
      }
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
    } while (bVar11);
    iVar6 = iVar6 + 1;
    if (iVar6 == 3) {
      funchook_set_error_message(funchook,"Failed to allocate memory in unused regions");
      return 8;
    }
  } while( true );
}

Assistant:

int funchook_page_alloc(funchook_t *funchook, funchook_page_t **page_out, uint8_t *func, ip_displacement_t *disp)
{
#if defined(CPU_64BIT)
    int loop_cnt;

    /* Loop three times just to avoid rare cases such as
     * unused memory region is used between 'get_free_address()'
     * and 'mmap()'.
     */
    for (loop_cnt = 0; loop_cnt < 3; loop_cnt++) {
        void *addrs[2];
        int rv = get_free_address(funchook, func, addrs);
        int i;

        if (rv != 0) {
            return rv;
        }
        for (i = 1; i >= 0; i--) {
            /* Try to use addr[1] (unused memory region after `func`)
             * and then addr[0] (before `func`)
             */
            if (addrs[i] == NULL) {
                continue;
            }
            *page_out = mmap(addrs[i], page_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
            if (SAFE_JUMP_DISTANCE(func, *page_out) ||
                    SAFE_JUMP_DISTANCE(*page_out, func)) {
                funchook_log(funchook, "  allocate page %p (size=%"PRIuPTR")\n", *page_out, page_size);
                return 0;
            }
            if (*page_out == MAP_FAILED) {
                char errbuf[128];

                funchook_set_error_message(funchook, "mmap failed(addr=%p): %s", addrs[i],
                                           funchook_strerror(errno, errbuf, sizeof(errbuf)));
                return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
            }
            funchook_log(funchook, "  try to allocate %p but %p (size=%"PRIuPTR")\n", addrs[i], *page_out, page_size);
            munmap(*page_out, page_size);
        }
    }
    funchook_set_error_message(funchook, "Failed to allocate memory in unused regions");
    return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
#else
    char errbuf[128];

    *page_out = mmap(NULL, page_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (*page_out != MAP_FAILED) {
        funchook_log(funchook, "  allocate page %p (size=%"PRIuPTR")\n", *page_out, page_size);
        return 0;
    }
    funchook_set_error_message(funchook, "mmap failed: %s", funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
#endif
}